

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O1

vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_> *
__thiscall
program_options::command_line_parser::parse_disguised_long_option
          (vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
           *__return_storage_ptr__,command_line_parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  char cVar1;
  style_t sVar2;
  pointer pbVar3;
  char *pcVar4;
  options_description *this_00;
  pointer pcVar5;
  option_description *poVar6;
  string local_50;
  
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (1 < pbVar3->_M_string_length) {
    pcVar4 = (pbVar3->_M_dataplus)._M_p;
    cVar1 = *pcVar4;
    if (((cVar1 == '-') && (pcVar4[1] != '-')) ||
       ((cVar1 == '/' && ((this->m_style & allow_slash_for_short) != 0)))) {
      this_00 = this->m_options_description;
      std::__cxx11::string::find((char)pbVar3,0x3d);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)pbVar3);
      sVar2 = this->m_style;
      poVar6 = options_description::find_nothrow
                         (this_00,&local_50,(bool)((byte)(sVar2 >> 9) & 1),
                          (bool)((byte)(sVar2 >> 10) & 1),(bool)((byte)(sVar2 >> 0xb) & 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (poVar6 != (option_description *)0x0) {
        std::__cxx11::string::replace
                  ((ulong)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,0,(char *)0x0,0x117834);
        pcVar5 = (((args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        if (pcVar5[1] == '/') {
          pcVar5[1] = '-';
        }
        parse_long_option(__return_storage_ptr__,this,args);
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<option>
command_line_parser::parse_disguised_long_option(std::vector<std::string>& args)
{
    const std::string& tok = args[0];
    if (tok.size() >= 2 &&
            ((tok[0] == '-' && tok[1] != '-') ||
             ((m_style & command_line_style::allow_slash_for_short) && tok[0] == '/')))
    {
        try
        {
            if (m_options_description->find_nothrow(
                tok.substr(1, tok.find('=')-1),
                is_style_active(command_line_style::allow_guessing),
                is_style_active(command_line_style::long_case_insensitive),
                is_style_active(command_line_style::short_case_insensitive)))
            {
                args[0].insert(0, "-");
                if (args[0][1] == '/')
                    args[0][1] = '-';
                return parse_long_option(args);
            }
        }
        catch(error_with_option_name& e)
        {
            // add context and rethrow
            e.add_context(tok, tok, get_canonical_option_prefix());
            throw;
        }
    }
    return std::vector<option>();
}